

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_max_ivec2(ShaderEvalContext *c)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar2 = (uint)c->in[0].m_data[3];
  uVar3 = (uint)c->in[0].m_data[1];
  uVar1 = *(undefined8 *)c->in[1].m_data;
  uVar4 = (uint)(float)uVar1;
  uVar5 = (uint)(float)((ulong)uVar1 >> 0x20);
  uVar6 = -(uint)((int)uVar5 < (int)uVar2);
  uVar7 = -(uint)((int)uVar4 < (int)uVar3);
  *(ulong *)((c->color).m_data + 1) =
       CONCAT44((float)(int)(~uVar7 & uVar4 | uVar3 & uVar7),
                (float)(int)(~uVar6 & uVar5 | uVar2 & uVar6));
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }